

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O1

void google::protobuf::compiler::java::WriteMessageDocComment
               (Printer *printer,Descriptor *message,Options *options,bool kdoc)

{
  undefined2 uVar1;
  undefined4 uVar2;
  pointer pcVar3;
  char *pcVar4;
  bool bVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  java *pjVar7;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view input;
  string_view input_00;
  SourceLocation location;
  long *local_130;
  long local_128;
  long local_120 [2];
  long *local_110;
  long local_108;
  long local_100 [3];
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  bool bStack_37;
  
  pcVar6 = (char *)CONCAT71(in_register_00000009,kdoc);
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  uVar1._0_1_ = options->opensource_runtime;
  uVar1._1_1_ = options->annotate_code;
  uVar2._0_1_ = options->generate_immutable_code;
  uVar2._1_1_ = options->generate_mutable_code;
  uVar2._2_1_ = options->generate_shared_code;
  uVar2._3_1_ = options->enforce_lite;
  local_130 = local_120;
  pcVar3 = (options->annotation_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar3,pcVar3 + (options->annotation_list_file)._M_string_length);
  local_110 = local_100;
  pcVar3 = (options->output_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar3,pcVar3 + (options->output_list_file)._M_string_length);
  local_100[2]._0_1_ = options->strip_nonfunctional_codegen;
  local_100[2]._1_1_ = options->jvm_dsl;
  local_e8._24_8_ = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._16_8_ = &local_c8;
  local_b8._M_p = (pointer)&local_a8;
  bVar5 = Descriptor::GetSourceLocation(message,(SourceLocation *)local_e8);
  if (bVar5) {
    local_78._M_p = (pointer)&local_68;
    local_80._0_4_ = uVar2;
    local_80._4_2_ = uVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_130,local_128 + (long)local_130);
    local_58._M_p = (pointer)&local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_110,local_108 + (long)local_110);
    local_38 = local_100[2]._0_1_;
    bStack_37 = local_100[2]._1_1_;
    pcVar6 = (char *)(ulong)kdoc;
    WriteDocCommentBodyForLocation(printer,(SourceLocation *)local_e8,(Options *)local_80,kdoc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,
                    CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._16_8_ != &local_c8) {
    operator_delete((void *)local_e8._16_8_,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (kdoc) {
    pcVar4 = (message->all_names_).payload_;
    pjVar7 = (java *)(ulong)*(ushort *)(pcVar4 + 2);
    input._M_len = pcVar4 + ~(ulong)pjVar7;
    input._M_str = pcVar6;
    EscapeKdoc_abi_cxx11_((string *)local_e8,pjVar7,input);
    text_00._M_str = " * Protobuf type `$fullname$`\n */\n";
    text_00._M_len = 0x22;
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer,text_00,(char (*) [9])"fullname",(string *)local_e8);
  }
  else {
    pcVar4 = (message->all_names_).payload_;
    pjVar7 = (java *)(ulong)*(ushort *)(pcVar4 + 2);
    input_00._M_len = pcVar4 + ~(ulong)pjVar7;
    input_00._M_str = pcVar6;
    EscapeJavadoc_abi_cxx11_((string *)local_e8,pjVar7,input_00);
    text_01._M_str = " * Protobuf type {@code $fullname$}\n */\n";
    text_01._M_len = 0x28;
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer,text_01,(char (*) [9])"fullname",(string *)local_e8);
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  return;
}

Assistant:

void WriteMessageDocComment(io::Printer* printer, const Descriptor* message,
                            const Options options, const bool kdoc) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, message, options, kdoc);
  if (kdoc) {
    printer->Print(
        " * Protobuf type `$fullname$`\n"
        " */\n",
        "fullname", EscapeKdoc(message->full_name()));
  } else {
    printer->Print(
        " * Protobuf type {@code $fullname$}\n"
        " */\n",
        "fullname", EscapeJavadoc(message->full_name()));
  }
}